

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeFenceHostSynchronize(ze_fence_handle_t hFence,uint64_t timeout)

{
  ze_pfnFenceHostSynchronize_t pfnHostSynchronize;
  dditable_t *dditable;
  ze_result_t result;
  uint64_t timeout_local;
  ze_fence_handle_t hFence_local;
  
  if (*(code **)(*(long *)(hFence + 8) + 0x440) == (code *)0x0) {
    hFence_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFence_local._4_4_ = (**(code **)(*(long *)(hFence + 8) + 0x440))(*(undefined8 *)hFence,timeout)
    ;
  }
  return hFence_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceHostSynchronize(
        ze_fence_handle_t hFence,                       ///< [in] handle of the fence
        uint64_t timeout                                ///< [in] if non-zero, then indicates the maximum time (in nanoseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then operates exactly like ::zeFenceQueryStatus;
                                                        ///< if `UINT64_MAX`, then function will not return until complete or
                                                        ///< device is lost.
                                                        ///< Due to external dependencies, timeout may be rounded to the closest
                                                        ///< value allowed by the accuracy of those dependencies.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_fence_object_t*>( hFence )->dditable;
        auto pfnHostSynchronize = dditable->ze.Fence.pfnHostSynchronize;
        if( nullptr == pfnHostSynchronize )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFence = reinterpret_cast<ze_fence_object_t*>( hFence )->handle;

        // forward to device-driver
        result = pfnHostSynchronize( hFence, timeout );

        return result;
    }